

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_listener.c
# Opt level: O1

void ht_tcp_listener_callback(TEventPtr events,size_t size,HT_Boolean serialized,void *user_data)

{
  HT_ListenerBuffer *buffer;
  HT_Boolean HVar1;
  
  ht_mutex_lock(*user_data);
  if (*(HT_TCPServer **)((long)user_data + 0x20) != (HT_TCPServer *)0x0) {
    HVar1 = ht_tcp_server_is_running(*(HT_TCPServer **)((long)user_data + 0x20));
    if (HVar1 != 0) {
      buffer = (HT_ListenerBuffer *)((long)user_data + 8);
      if (serialized == 0) {
        ht_listener_buffer_process_unserialized_events
                  (buffer,events,size,ht_tcp_listener_f_flush,user_data);
      }
      else {
        ht_listener_buffer_process_serialized_events
                  (buffer,events,size,ht_tcp_listener_f_flush,user_data);
      }
      if (*(int *)((long)user_data + 0x2c) != 0) {
        ht_listener_buffer_flush(buffer,ht_tcp_listener_f_flush,user_data);
        *(undefined4 *)((long)user_data + 0x2c) = 0;
      }
    }
  }
  ht_mutex_unlock(*user_data);
  return;
}

Assistant:

void
ht_tcp_listener_callback(TEventPtr events, size_t size, HT_Boolean serialized, void* user_data)
{
    ht_tcp_listener_push_events((HT_TCPListener*)user_data, events, size, serialized);
}